

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

void csp_eth_arp_set_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  arp_list_entry_t *paVar1;
  arp_list_entry_t *paVar2;
  uint16_t in_SI;
  undefined4 *in_RDI;
  arp_list_entry_t *new_arp;
  arp_list_entry_t *arp;
  arp_list_entry_t *last_arp;
  arp_list_entry_t *local_20;
  arp_list_entry_t *local_18;
  
  local_18 = (arp_list_entry_t *)0x0;
  local_20 = arp_list;
  while( true ) {
    if (local_20 == (arp_list_entry_t *)0x0) {
      paVar2 = arp_alloc();
      paVar1 = arp_list;
      if (paVar2 != (arp_list_entry_t *)0x0) {
        paVar2->csp_addr = in_SI;
        *(undefined4 *)paVar2->mac_addr = *in_RDI;
        *(undefined2 *)(paVar2->mac_addr + 4) = *(undefined2 *)(in_RDI + 1);
        paVar2->next = (arp_list_entry_s *)0x0;
        paVar1 = paVar2;
        if (local_18 != (arp_list_entry_t *)0x0) {
          local_18->next = paVar2;
          paVar1 = arp_list;
        }
      }
      arp_list = paVar1;
      return;
    }
    local_18 = local_20;
    if (local_20->csp_addr == in_SI) break;
    local_20 = local_20->next;
  }
  return;
}

Assistant:

void csp_eth_arp_set_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    arp_list_entry_t * last_arp = 0;
    for (arp_list_entry_t * arp = arp_list; arp; arp = arp->next) {
        last_arp = arp;
        if (arp->csp_addr == csp_addr) {
            // Already set
            return;
        }
    }

    // Create and add a new ARP entry
    arp_list_entry_t * new_arp = arp_alloc();

    if (new_arp) {
        new_arp->csp_addr = csp_addr;
        memcpy(new_arp->mac_addr, mac_addr, CSP_ETH_ALEN);
        new_arp->next = 0;

        if (last_arp) {
            last_arp->next = new_arp;
        } else {
            arp_list = new_arp;
        }
    }

}